

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpresponseparser.h
# Opt level: O0

ParseResult __thiscall
httpparser::HttpResponseParser::consume
          (HttpResponseParser *this,Response *resp,char *begin,char *end)

{
  bool bVar1;
  int iVar2;
  vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
  *this_00;
  reference pvVar3;
  vector<char,_std::allocator<char>_> *this_01;
  size_type sVar4;
  size_t sVar5;
  char *pcVar6;
  __normal_iterator<httpparser::Response::HeaderItem_*,_std::vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>_>
  local_b0;
  HeaderItem *local_a8;
  __normal_iterator<httpparser::Response::HeaderItem_*,_std::vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>_>
  local_a0;
  __normal_iterator<httpparser::Response::HeaderItem_*,_std::vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>_>
  local_98;
  iterator it;
  HeaderItem *h;
  HeaderItem local_78;
  char local_31;
  char *pcStack_30;
  char input;
  char *end_local;
  char *begin_local;
  Response *resp_local;
  HttpResponseParser *this_local;
  
  pcStack_30 = end;
  end_local = begin;
  begin_local = (char *)resp;
  resp_local = (Response *)this;
  do {
    if (end_local == pcStack_30) {
      return ParsingIncompleted;
    }
    pcVar6 = end_local + 1;
    local_31 = *end_local;
    end_local = pcVar6;
    switch(this->state) {
    case ResponseStatusStart:
      if (local_31 != 'H') {
        return ParsingError;
      }
      this->state = ResponseHttpVersion_ht;
      break;
    case ResponseHttpVersion_ht:
      if (local_31 != 'T') {
        return ParsingError;
      }
      this->state = ResponseHttpVersion_htt;
      break;
    case ResponseHttpVersion_htt:
      if (local_31 != 'T') {
        return ParsingError;
      }
      this->state = ResponseHttpVersion_http;
      break;
    case ResponseHttpVersion_http:
      if (local_31 != 'P') {
        return ParsingError;
      }
      this->state = ResponseHttpVersion_slash;
      break;
    case ResponseHttpVersion_slash:
      if (local_31 != '/') {
        return ParsingError;
      }
      begin_local[0] = '\0';
      begin_local[1] = '\0';
      begin_local[2] = '\0';
      begin_local[3] = '\0';
      begin_local[4] = '\0';
      begin_local[5] = '\0';
      begin_local[6] = '\0';
      begin_local[7] = '\0';
      this->state = ResponseHttpVersion_majorStart;
      break;
    case ResponseHttpVersion_majorStart:
      bVar1 = isDigit(this,(int)local_31);
      if (!bVar1) {
        return ParsingError;
      }
      *(int *)begin_local = local_31 + -0x30;
      this->state = ResponseHttpVersion_major;
      break;
    case ResponseHttpVersion_major:
      if (local_31 == '.') {
        this->state = ResponseHttpVersion_minorStart;
      }
      else {
        bVar1 = isDigit(this,(int)local_31);
        if (!bVar1) {
          return ParsingError;
        }
        *(int *)begin_local = *(int *)begin_local * 10 + (int)local_31 + -0x30;
      }
      break;
    case ResponseHttpVersion_minorStart:
      bVar1 = isDigit(this,(int)local_31);
      if (!bVar1) {
        return ParsingError;
      }
      *(int *)(begin_local + 4) = local_31 + -0x30;
      this->state = ResponseHttpVersion_minor;
      break;
    case ResponseHttpVersion_minor:
      if (local_31 == ' ') {
        this->state = ResponseHttpVersion_statusCodeStart;
        begin_local[0x3c] = '\0';
        begin_local[0x3d] = '\0';
        begin_local[0x3e] = '\0';
        begin_local[0x3f] = '\0';
      }
      else {
        bVar1 = isDigit(this,(int)local_31);
        if (!bVar1) {
          return ParsingError;
        }
        *(int *)(begin_local + 4) = *(int *)(begin_local + 4) * 10 + (int)local_31 + -0x30;
      }
      break;
    case ResponseHttpVersion_statusCodeStart:
      bVar1 = isDigit(this,(int)local_31);
      if (!bVar1) {
        return ParsingError;
      }
      *(int *)(begin_local + 0x3c) = local_31 + -0x30;
      this->state = ResponseHttpVersion_statusCode;
      break;
    case ResponseHttpVersion_statusCode:
      bVar1 = isDigit(this,(int)local_31);
      if (bVar1) {
        *(int *)(begin_local + 0x3c) = *(int *)(begin_local + 0x3c) * 10 + (int)local_31 + -0x30;
      }
      else {
        if ((*(uint *)(begin_local + 0x3c) < 100) || (999 < *(uint *)(begin_local + 0x3c))) {
          return ParsingError;
        }
        if (local_31 != ' ') {
          return ParsingError;
        }
        this->state = ResponseHttpVersion_statusTextStart;
      }
      break;
    case ResponseHttpVersion_statusTextStart:
      bVar1 = isChar(this,(int)local_31);
      if (!bVar1) {
        return ParsingError;
      }
      std::__cxx11::string::operator+=((string *)(begin_local + 0x40),local_31);
      this->state = ResponseHttpVersion_statusText;
      break;
    case ResponseHttpVersion_statusText:
      if (local_31 == '\r') {
        this->state = ResponseHttpVersion_newLine;
      }
      else {
        bVar1 = isChar(this,(int)local_31);
        if (!bVar1) {
          return ParsingError;
        }
        std::__cxx11::string::operator+=((string *)(begin_local + 0x40),local_31);
      }
      break;
    case ResponseHttpVersion_newLine:
      if (local_31 != '\n') {
        return ParsingError;
      }
      this->state = HeaderLineStart;
      break;
    case HeaderLineStart:
      if (local_31 == '\r') {
        this->state = ExpectingNewline_3;
      }
      else {
        bVar1 = std::
                vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                ::empty((vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                         *)(begin_local + 8));
        if ((bVar1) || ((local_31 != ' ' && (local_31 != '\t')))) {
          bVar1 = isChar(this,(int)local_31);
          if ((!bVar1) ||
             ((bVar1 = isControl(this,(int)local_31), bVar1 ||
              (bVar1 = isSpecial(this,(int)local_31), bVar1)))) {
            return ParsingError;
          }
          this_00 = (vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                     *)(begin_local + 8);
          local_78.value.field_2._M_allocated_capacity = 0;
          local_78.value.field_2._8_8_ = 0;
          local_78.value._M_dataplus = (_Alloc_hider)0x0;
          local_78.value._1_7_ = 0;
          local_78.value._M_string_length = 0;
          local_78.name.field_2._M_allocated_capacity = 0;
          local_78.name.field_2._8_8_ = 0;
          local_78.name._M_dataplus = (_Alloc_hider)0x0;
          local_78.name._1_7_ = 0;
          local_78.name._M_string_length = 0;
          Response::HeaderItem::HeaderItem(&local_78);
          std::
          vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
          ::push_back(this_00,&local_78);
          Response::HeaderItem::~HeaderItem(&local_78);
          pvVar3 = std::
                   vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                   ::back((vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                           *)(begin_local + 8));
          std::__cxx11::string::reserve((ulong)pvVar3);
          pvVar3 = std::
                   vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                   ::back((vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                           *)(begin_local + 8));
          std::__cxx11::string::reserve((ulong)&pvVar3->value);
          pvVar3 = std::
                   vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                   ::back((vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                           *)(begin_local + 8));
          std::__cxx11::string::push_back((char)pvVar3);
          this->state = HeaderName;
        }
        else {
          this->state = HeaderLws;
        }
      }
      break;
    case HeaderLws:
      if (local_31 == '\r') {
        this->state = ExpectingNewline_2;
      }
      else if ((local_31 != ' ') && (local_31 != '\t')) {
        bVar1 = isControl(this,(int)local_31);
        if (bVar1) {
          return ParsingError;
        }
        this->state = HeaderValue;
        pvVar3 = std::
                 vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                 ::back((vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                         *)(begin_local + 8));
        std::__cxx11::string::push_back((char)pvVar3 + ' ');
      }
      break;
    case HeaderName:
      if (local_31 == ':') {
        this->state = SpaceBeforeHeaderValue;
      }
      else {
        bVar1 = isChar(this,(int)local_31);
        if (((!bVar1) || (bVar1 = isControl(this,(int)local_31), bVar1)) ||
           (bVar1 = isSpecial(this,(int)local_31), bVar1)) {
          return ParsingError;
        }
        pvVar3 = std::
                 vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                 ::back((vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                         *)(begin_local + 8));
        std::__cxx11::string::push_back((char)pvVar3);
      }
      break;
    case SpaceBeforeHeaderValue:
      if (local_31 != ' ') {
        return ParsingError;
      }
      this->state = HeaderValue;
      break;
    case HeaderValue:
      if (local_31 == '\r') {
        it._M_current =
             std::
             vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
             ::back((vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                     *)(begin_local + 8));
        pcVar6 = (char *)std::__cxx11::string::c_str();
        iVar2 = strcasecmp(pcVar6,"Content-Length");
        if (iVar2 == 0) {
          pcVar6 = (char *)std::__cxx11::string::c_str();
          iVar2 = atoi(pcVar6);
          this->contentSize = (long)iVar2;
          std::vector<char,_std::allocator<char>_>::reserve
                    ((vector<char,_std::allocator<char>_> *)(begin_local + 0x20),this->contentSize);
        }
        else {
          pcVar6 = (char *)std::__cxx11::string::c_str();
          iVar2 = strcasecmp(pcVar6,"Transfer-Encoding");
          if (iVar2 == 0) {
            pcVar6 = (char *)std::__cxx11::string::c_str();
            iVar2 = strcasecmp(pcVar6,"chunked");
            if (iVar2 == 0) {
              this->chunked = true;
            }
          }
        }
        this->state = ExpectingNewline_2;
      }
      else {
        bVar1 = isControl(this,(int)local_31);
        if (bVar1) {
          return ParsingError;
        }
        pvVar3 = std::
                 vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                 ::back((vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                         *)(begin_local + 8));
        std::__cxx11::string::push_back((char)pvVar3 + ' ');
      }
      break;
    case ExpectingNewline_2:
      if (local_31 != '\n') {
        return ParsingError;
      }
      this->state = HeaderLineStart;
      break;
    case ExpectingNewline_3:
      local_a0._M_current =
           (HeaderItem *)
           std::
           vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
           ::begin((vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                    *)(begin_local + 8));
      local_a8 = (HeaderItem *)
                 std::
                 vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                 ::end((vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                        *)(begin_local + 8));
      local_98 = std::
                 find_if<__gnu_cxx::__normal_iterator<httpparser::Response::HeaderItem*,std::vector<httpparser::Response::HeaderItem,std::allocator<httpparser::Response::HeaderItem>>>,bool(*)(httpparser::Response::HeaderItem_const&)>
                           (local_a0,(__normal_iterator<httpparser::Response::HeaderItem_*,_std::vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>_>
                                      )local_a8,checkIfConnection);
      local_b0._M_current =
           (HeaderItem *)
           std::
           vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
           ::end((vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                  *)(begin_local + 8));
      bVar1 = __gnu_cxx::operator!=(&local_98,&local_b0);
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<httpparser::Response::HeaderItem_*,_std::vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>_>
        ::operator->(&local_98);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        iVar2 = strcasecmp(pcVar6,"Keep-Alive");
        if (iVar2 == 0) {
          begin_local[0x38] = '\x01';
        }
        else {
          begin_local[0x38] = '\0';
        }
      }
      else if ((1 < *(int *)begin_local) ||
              ((*(int *)begin_local == 1 && (*(int *)(begin_local + 4) == 1)))) {
        begin_local[0x38] = '\x01';
      }
      if ((this->chunked & 1U) == 0) {
        if (this->contentSize == 0) {
          if (local_31 == '\n') {
            return ParsingCompleted;
          }
          return ParsingError;
        }
        this->state = Post;
      }
      else {
        this->state = ChunkSize;
      }
      break;
    case Post:
      this->contentSize = this->contentSize - 1;
      std::vector<char,_std::allocator<char>_>::push_back
                ((vector<char,_std::allocator<char>_> *)(begin_local + 0x20),&local_31);
      if (this->contentSize == 0) {
        return ParsingCompleted;
      }
      break;
    case ChunkSize:
      iVar2 = isalnum((int)local_31);
      if (iVar2 == 0) {
        if (local_31 == ';') {
          this->state = ChunkExtensionName;
        }
        else {
          if (local_31 != '\r') {
            return ParsingError;
          }
          this->state = ChunkSizeNewLine;
        }
      }
      else {
        std::__cxx11::string::push_back((char)this + '\x10');
      }
      break;
    case ChunkExtensionName:
      iVar2 = isalnum((int)local_31);
      if ((iVar2 == 0) && (local_31 != ' ')) {
        if (local_31 == '=') {
          this->state = ChunkExtensionValue;
        }
        else {
          if (local_31 != '\r') {
            return ParsingError;
          }
          this->state = ChunkSizeNewLine;
        }
      }
      break;
    case ChunkExtensionValue:
      iVar2 = isalnum((int)local_31);
      if ((iVar2 == 0) && (local_31 != ' ')) {
        if (local_31 != '\r') {
          return ParsingError;
        }
        this->state = ChunkSizeNewLine;
      }
      break;
    case ChunkSizeNewLine:
      if (local_31 != '\n') {
        return ParsingError;
      }
      pcVar6 = (char *)std::__cxx11::string::c_str();
      sVar5 = strtol(pcVar6,(char **)0x0,0x10);
      this->chunkSize = sVar5;
      std::__cxx11::string::clear();
      this_01 = (vector<char,_std::allocator<char>_> *)(begin_local + 0x20);
      sVar4 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)(begin_local + 0x20));
      std::vector<char,_std::allocator<char>_>::reserve(this_01,sVar4 + this->chunkSize);
      if (this->chunkSize == 0) {
        this->state = ChunkSizeNewLine_2;
      }
      else {
        this->state = ChunkData;
      }
      break;
    case ChunkSizeNewLine_2:
      if (local_31 == '\r') {
        this->state = ChunkSizeNewLine_3;
      }
      else {
        iVar2 = isalpha((int)local_31);
        if (iVar2 == 0) {
          return ParsingError;
        }
        this->state = ChunkTrailerName;
      }
      break;
    case ChunkSizeNewLine_3:
      if (local_31 == '\n') {
        return ParsingCompleted;
      }
      return ParsingError;
    case ChunkTrailerName:
      iVar2 = isalnum((int)local_31);
      if (iVar2 == 0) {
        if (local_31 != ':') {
          return ParsingError;
        }
        this->state = ChunkTrailerValue;
      }
      break;
    case ChunkTrailerValue:
      iVar2 = isalnum((int)local_31);
      if ((iVar2 == 0) && (local_31 != ' ')) {
        if (local_31 != '\r') {
          return ParsingError;
        }
        this->state = ChunkSizeNewLine;
      }
      break;
    case ChunkDataNewLine_1:
      if (local_31 != '\r') {
        return ParsingError;
      }
      this->state = ChunkDataNewLine_2;
      break;
    case ChunkDataNewLine_2:
      if (local_31 != '\n') {
        return ParsingError;
      }
      this->state = ChunkSize;
      break;
    case ChunkData:
      std::vector<char,_std::allocator<char>_>::push_back
                ((vector<char,_std::allocator<char>_> *)(begin_local + 0x20),&local_31);
      sVar5 = this->chunkSize - 1;
      this->chunkSize = sVar5;
      if (sVar5 == 0) {
        this->state = ChunkDataNewLine_1;
      }
      break;
    default:
      return ParsingError;
    }
  } while( true );
}

Assistant:

ParseResult consume(Response &resp, const char *begin, const char *end)
    {
        while( begin != end )
        {
            char input = *begin++;

            switch (state)
            {
            case ResponseStatusStart:
                if( input != 'H' )
                {
                    return ParsingError;
                }
                else
                {
                    state = ResponseHttpVersion_ht;
                }
                break;
            case ResponseHttpVersion_ht:
                if( input == 'T' )
                {
                    state = ResponseHttpVersion_htt;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_htt:
                if( input == 'T' )
                {
                    state = ResponseHttpVersion_http;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_http:
                if( input == 'P' )
                {
                    state = ResponseHttpVersion_slash;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_slash:
                if( input == '/' )
                {
                    resp.versionMajor = 0;
                    resp.versionMinor = 0;
                    state = ResponseHttpVersion_majorStart;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_majorStart:
                if( isDigit(input) )
                {
                    resp.versionMajor = input - '0';
                    state = ResponseHttpVersion_major;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_major:
                if( input == '.' )
                {
                    state = ResponseHttpVersion_minorStart;
                }
                else if( isDigit(input) )
                {
                    resp.versionMajor = resp.versionMajor * 10 + input - '0';
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_minorStart:
                if( isDigit(input) )
                {
                    resp.versionMinor = input - '0';
                    state = ResponseHttpVersion_minor;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_minor:
                if( input == ' ')
                {
                    state = ResponseHttpVersion_statusCodeStart;
                    resp.statusCode = 0;
                }
                else if( isDigit(input) )
                {
                    resp.versionMinor = resp.versionMinor * 10 + input - '0';
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_statusCodeStart:
                if( isDigit(input) )
                {
                    resp.statusCode = input - '0';
                    state = ResponseHttpVersion_statusCode;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_statusCode:
                if( isDigit(input) )
                {
                    resp.statusCode = resp.statusCode * 10 + input - '0';
                }
                else
                {
                    if( resp.statusCode < 100 || resp.statusCode > 999 )
                    {
                        return ParsingError;
                    }
                    else if( input == ' ' )
                    {
                        state = ResponseHttpVersion_statusTextStart;
                    }
                    else
                    {
                        return ParsingError;
                    }
                }
                break;
            case ResponseHttpVersion_statusTextStart:
                if( isChar(input) )
                {
                    resp.status += input;
                    state = ResponseHttpVersion_statusText;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_statusText:
                if( input == '\r' )
                {
                    state = ResponseHttpVersion_newLine;
                }
                else if( isChar(input) )
                {
                    resp.status += input;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_newLine:
                if( input == '\n' )
                {
                    state = HeaderLineStart;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case HeaderLineStart:
                if( input == '\r' )
                {
                    state = ExpectingNewline_3;
                }
                else if( !resp.headers.empty() && (input == ' ' || input == '\t') )
                {
                    state = HeaderLws;
                }
                else if( !isChar(input) || isControl(input) || isSpecial(input) )
                {
                    return ParsingError;
                }
                else
                {
                    resp.headers.push_back(Response::HeaderItem());
                    resp.headers.back().name.reserve(16);
                    resp.headers.back().value.reserve(16);
                    resp.headers.back().name.push_back(input);
                    state = HeaderName;
                }
                break;
            case HeaderLws:
                if( input == '\r' )
                {
                    state = ExpectingNewline_2;
                }
                else if( input == ' ' || input == '\t' )
                {
                }
                else if( isControl(input) )
                {
                    return ParsingError;
                }
                else
                {
                    state = HeaderValue;
                    resp.headers.back().value.push_back(input);
                }
                break;
            case HeaderName:
                if( input == ':' )
                {
                    state = SpaceBeforeHeaderValue;
                }
                else if( !isChar(input) || isControl(input) || isSpecial(input) )
                {
                    return ParsingError;
                }
                else
                {
                    resp.headers.back().name.push_back(input);
                }
                break;
            case SpaceBeforeHeaderValue:
                if( input == ' ' )
                {
                    state = HeaderValue;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case HeaderValue:
                if( input == '\r' )
                {
                    Response::HeaderItem &h = resp.headers.back();

                    if( strcasecmp(h.name.c_str(), "Content-Length") == 0 )
                    {
                        contentSize = atoi(h.value.c_str());
                        resp.content.reserve( contentSize );
                    }
                    else if( strcasecmp(h.name.c_str(), "Transfer-Encoding") == 0 )
                    {
                        if(strcasecmp(h.value.c_str(), "chunked") == 0)
                            chunked = true;
                    }
                    state = ExpectingNewline_2;
                }
                else if( isControl(input) )
                {
                    return ParsingError;
                }
                else
                {
                    resp.headers.back().value.push_back(input);
                }
                break;
            case ExpectingNewline_2:
                if( input == '\n' )
                {
                    state = HeaderLineStart;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ExpectingNewline_3: {
                std::vector<Response::HeaderItem>::iterator it = std::find_if(resp.headers.begin(),
                                                                    resp.headers.end(),
                                                                    checkIfConnection);

                if( it != resp.headers.end() )
                {
                    if( strcasecmp(it->value.c_str(), "Keep-Alive") == 0 )
                    {
                        resp.keepAlive = true;
                    }
                    else  // == Close
                    {
                        resp.keepAlive = false;
                    }
                }
                else
                {
                    if( resp.versionMajor > 1 || (resp.versionMajor == 1 && resp.versionMinor == 1) )
                        resp.keepAlive = true;
                }

                if( chunked )
                {
                    state = ChunkSize;
                }
                else if( contentSize == 0 )
                {
                    if( input == '\n')
                        return ParsingCompleted;
                    else
                        return ParsingError;
                }

                else
                {
                    state = Post;
                }
                break;
            }
            case Post:
                --contentSize;
                resp.content.push_back(input);

                if( contentSize == 0 )
                {
                    return ParsingCompleted;
                }
                break;
            case ChunkSize:
                if( isalnum(input) )
                {
                    chunkSizeStr.push_back(input);
                }
                else if( input == ';' )
                {
                    state = ChunkExtensionName;
                }
                else if( input == '\r' )
                {
                    state = ChunkSizeNewLine;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkExtensionName:
                if( isalnum(input) || input == ' ' )
                {
                    // skip
                }
                else if( input == '=' )
                {
                    state = ChunkExtensionValue;
                }
                else if( input == '\r' )
                {
                    state = ChunkSizeNewLine;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkExtensionValue:
                if( isalnum(input) || input == ' ' )
                {
                    // skip
                }
                else if( input == '\r' )
                {
                    state = ChunkSizeNewLine;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkSizeNewLine:
                if( input == '\n' )
                {
                    chunkSize = strtol(chunkSizeStr.c_str(), NULL, 16);
                    chunkSizeStr.clear();
                    resp.content.reserve(resp.content.size() + chunkSize);

                    if( chunkSize == 0 )
                        state = ChunkSizeNewLine_2;
                    else
                        state = ChunkData;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkSizeNewLine_2:
                if( input == '\r' )
                {
                    state = ChunkSizeNewLine_3;
                }
                else if( isalpha(input) )
                {
                    state = ChunkTrailerName;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkSizeNewLine_3:
                if( input == '\n' )
                {
                    return ParsingCompleted;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkTrailerName:
                if( isalnum(input) )
                {
                    // skip
                }
                else if( input == ':' )
                {
                    state = ChunkTrailerValue;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkTrailerValue:
                if( isalnum(input) || input == ' ' )
                {
                    // skip
                }
                else if( input == '\r' )
                {
                    state = ChunkSizeNewLine;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkData:
                resp.content.push_back(input);

                if( --chunkSize == 0 )
                {
                    state = ChunkDataNewLine_1;
                }
                break;
            case ChunkDataNewLine_1:
                if( input == '\r' )
                {
                    state = ChunkDataNewLine_2;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkDataNewLine_2:
                if( input == '\n' )
                {
                    state = ChunkSize;
                }
                else
                {
                    return ParsingError;
                }
                break;
            default:
                return ParsingError;
            }
        }

        return ParsingIncompleted;
    }